

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

bool __thiscall
runtime::VirtualMachine::variableEquals(VirtualMachine *this,Variable var1,Variable var2)

{
  anon_union_8_6_52c89740_for_Variable_1 __lhs;
  allocator<char> local_59;
  string local_58;
  VirtualMachine *local_38;
  VirtualMachine *this_local;
  Variable var2_local;
  Variable var1_local;
  
  var2_local._0_8_ = var2.field_1;
  __lhs = var1.field_1;
  var2_local.field_1.integerValue._0_4_ = var1.type;
  this_local._0_4_ = var2.type;
  if (var2_local.field_1.integerValue._0_4_ == (VariableType)this_local) {
    local_38 = this;
    switch(var2_local.field_1.integerValue._0_4_) {
    case 0:
      var1_local.field_1.integerValue._7_1_ = 1;
      break;
    case 1:
      var1_local.field_1.integerValue._7_1_ = __lhs.integerValue == var2_local._0_8_;
      break;
    case 2:
      var1_local.type._0_1_ = var1.field_1._0_1_;
      var2_local.type._0_1_ = var2.field_1._0_1_;
      var1_local.field_1.integerValue._7_1_ =
           ((undefined1)var1_local.type & Integer) == ((undefined1)var2_local.type & Integer);
      break;
    case 3:
      var1_local.field_1.integerValue._7_1_ = __lhs.doubleValue == (double)var2_local._0_8_;
      break;
    case 4:
      var1_local.field_1._7_1_ =
           std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)var2_local._0_8_);
      break;
    case 5:
      var1_local.field_1.integerValue._7_1_ = __lhs.integerValue == var2_local._0_8_;
      break;
    case 6:
      var1_local.field_1.integerValue._7_1_ = __lhs.integerValue == var2_local._0_8_;
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Unknown varible type at variableEquals",&local_59);
      panic(this,&local_58);
    }
  }
  else {
    var1_local.field_1.integerValue._7_1_ = 0;
  }
  return var1_local.field_1._7_1_;
}

Assistant:

bool VirtualMachine::variableEquals(Variable var1, Variable var2) {
  if (var1.type != var2.type) {
    return false;
  }

  switch (var1.type) {
    case VariableType::Integer: {
      return var1.integerValue == var2.integerValue;
    }
    case VariableType::Float: {
      return var1.doubleValue == var2.doubleValue;
    }
    case VariableType::Function: {
      return var1.functionValue == var2.functionValue;
    }
    case VariableType::Object: {
      return var1.objectValue == var2.objectValue;
    }
    case VariableType::String: {
      return *var1.stringValue == *var2.stringValue;
    }
    case VariableType::Undefined: {
      return true;
    }
    case VariableType::Boolean: {
      return var1.boolValue == var2.boolValue;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }
}